

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::getGlobalElemDecl(TraverseSchema *this,DOMElement *elem,XMLCh *qName)

{
  XMLBuffer *this_00;
  ulong uVar1;
  SchemaInfo **enclosingSchema;
  short *psVar2;
  XMLStringPool *pXVar3;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar4;
  ulong uVar5;
  SchemaInfo *pSVar6;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Grammar *pGVar12;
  undefined4 extraout_var_02;
  SchemaInfo *toRestore_00;
  DOMElement *elem_00;
  SchemaElementDecl *pSVar13;
  XMLCh *pXVar14;
  XMLSize_t XVar15;
  XMLCh *pXVar16;
  ulong uVar17;
  XMLSize_t getAt;
  ListType aListType;
  
  iVar9 = XMLString::indexOf(qName,L':');
  if (iVar9 + 1U < 2) {
    pXVar14 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,qName,(long)iVar9);
    pXVar3 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar10 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3);
    iVar9 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar10);
    pXVar14 = (XMLCh *)CONCAT44(extraout_var,iVar9);
  }
  pXVar14 = resolvePrefixToURI(this,elem,pXVar14);
  iVar9 = XMLString::indexOf(qName,L':');
  XVar15 = 0;
  if (qName != (XMLCh *)0x0) {
    do {
      psVar2 = (short *)((long)qName + XVar15);
      XVar15 = XVar15 + 2;
    } while (*psVar2 != 0);
    XVar15 = ((long)XVar15 >> 1) - 1;
  }
  if (XVar15 == (long)(iVar9 + 1)) {
    pXVar16 = L"";
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar9 == -1) {
      this_00->fIndex = 0;
    }
    else {
      qName = qName + (long)iVar9 + 1;
      XVar15 = XVar15 + ~(long)iVar9;
      this_00->fIndex = 0;
    }
    XMLBuffer::append(this_00,qName,XVar15);
    pXVar3 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar10 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3);
    iVar9 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar10);
    pXVar16 = (XMLCh *)CONCAT44(extraout_var_00,iVar9);
  }
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  uVar10 = this->fCurrentScope;
  uVar11 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
  if (this->fSchemaInfo->fTargetNSURI == uVar11) {
    iVar9 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                      (this->fSchemaGrammar,(ulong)(uint)this->fTargetNSURI,pXVar16,0,0xfffffffe);
    pSVar13 = (SchemaElementDecl *)CONCAT44(extraout_var_01,iVar9);
    aListType = INCLUDE;
    if (pSVar13 == (SchemaElementDecl *)0x0) {
LAB_00332325:
      elem_00 = SchemaInfo::getTopLevelComponent
                          (*enclosingSchema,5,L"element",pXVar16,enclosingSchema);
      if ((elem_00 == (DOMElement *)0x0) ||
         (pSVar13 = traverseElementDecl(this,elem_00,true), pSVar13 == (SchemaElementDecl *)0x0)) {
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,pXVar14,pXVar16
                          ,(XMLCh *)0x0,(XMLCh *)0x0);
        pSVar13 = (SchemaElementDecl *)0x0;
      }
    }
LAB_00332387:
    if (toRestore != *enclosingSchema) {
      restoreSchemaInfo(this,toRestore,aListType,uVar10);
    }
  }
  else {
    pVVar4 = this->fImportedNSList;
    if ((pVVar4 == (ValueVectorOf<int> *)0x0) || (uVar5 = pVVar4->fCurCount, uVar5 == 0)) {
LAB_00332244:
      pXVar16 = L"http://apache.org/xml/messages/XMLErrors";
      iVar9 = 0x8e;
    }
    else {
      if (*pVVar4->fElemList != uVar11) {
        uVar17 = 0;
        do {
          if (uVar5 - 1 == uVar17) goto LAB_00332244;
          uVar1 = uVar17 + 1;
          lVar8 = uVar17 + 1;
          uVar17 = uVar1;
        } while (pVVar4->fElemList[lVar8] != uVar11);
        if (uVar5 <= uVar1) goto LAB_00332244;
      }
      pGVar12 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar14);
      if ((pGVar12 != (Grammar *)0x0) &&
         (iVar9 = (*(pGVar12->super_XSerializable)._vptr_XSerializable[5])(pGVar12), iVar9 == 1)) {
        iVar9 = (*(pGVar12->super_XSerializable)._vptr_XSerializable[0xb])
                          (pGVar12,(ulong)uVar11,pXVar16,0,0xfffffffe);
        pSVar13 = (SchemaElementDecl *)CONCAT44(extraout_var_02,iVar9);
        if (pSVar13 == (SchemaElementDecl *)0x0) {
          pSVar6 = *enclosingSchema;
          pRVar7 = pSVar6->fImportedInfoList;
          if ((pRVar7 != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) &&
             (XVar15 = (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount,
             XVar15 != 0)) {
            getAt = 0;
            do {
              toRestore_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                       (&pSVar6->fImportedInfoList->
                                         super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
              if (toRestore_00->fTargetNSURI == uVar11) {
                if (toRestore_00->fProcessed != true) {
                  aListType = IMPORT;
                  restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
                  goto LAB_00332325;
                }
                break;
              }
              getAt = getAt + 1;
            } while (XVar15 != getAt);
          }
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,pXVar14,
                            pXVar16,(XMLCh *)0x0,(XMLCh *)0x0);
          return (SchemaElementDecl *)0x0;
        }
        aListType = INCLUDE;
        goto LAB_00332387;
      }
      pXVar16 = L"http://apache.org/xml/messages/XMLValidity";
      iVar9 = 0x26;
    }
    pSVar13 = (SchemaElementDecl *)0x0;
    reportSchemaError(this,elem,pXVar16,iVar9,pXVar14,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  return pSVar13;
}

Assistant:

SchemaElementDecl*
TraverseSchema::getGlobalElemDecl(const DOMElement* const elem,
                                  const XMLCh* const qName)
{
    const XMLCh*         nameURI =  resolvePrefixToURI(elem, getPrefix(qName));
    const XMLCh*         localPart = getLocalPart(qName);
    SchemaElementDecl*   elemDecl = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;
    unsigned int         uriId = fURIStringPool->addOrFind(nameURI);

    if (fSchemaInfo->getTargetNSURI() != (int) uriId)
    {
    //if (!XMLString::equals(nameURI, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        if (!isImportingNS(uriId))
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, nameURI);
            return 0;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(nameURI);

        if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType)
        {
            elemDecl = (SchemaElementDecl*) grammar->getElemDecl(
                uriId, localPart, 0, Grammar::TOP_LEVEL_SCOPE);
        }
        else
        {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, nameURI);
            return 0;
        }

        if (!elemDecl)
        {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);
            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, nameURI, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }
    else
    {
        elemDecl = (SchemaElementDecl*)
            fSchemaGrammar->getElemDecl(fTargetNSURI, localPart, 0, Grammar::TOP_LEVEL_SCOPE);
    }

    if (!elemDecl)
    {
        DOMElement* subsGroupElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Element,
            SchemaSymbols::fgELT_ELEMENT,localPart, &fSchemaInfo);

        if (subsGroupElem)
            elemDecl = traverseElementDecl(subsGroupElem, true);

        if (!elemDecl)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, nameURI, localPart);
    }

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    return elemDecl;
}